

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

uint aiGetMaterialTextureCount(aiMaterial *pMat,aiTextureType type)

{
  int iVar1;
  uint *puVar2;
  uint local_2c;
  aiMaterialProperty *local_28;
  aiMaterialProperty *prop;
  uint local_18;
  uint i;
  uint max;
  aiTextureType type_local;
  aiMaterial *pMat_local;
  
  i = type;
  _max = pMat;
  if (pMat != (aiMaterial *)0x0) {
    local_18 = 0;
    for (prop._4_4_ = 0; prop._4_4_ < _max->mNumProperties; prop._4_4_ = prop._4_4_ + 1) {
      local_28 = _max->mProperties[prop._4_4_];
      if (local_28 != (aiMaterialProperty *)0x0) {
        iVar1 = strcmp((local_28->mKey).data,"$tex.file");
        if ((iVar1 == 0) && (local_28->mSemantic == i)) {
          local_2c = local_28->mIndex + 1;
          puVar2 = std::max<unsigned_int>(&local_18,&local_2c);
          local_18 = *puVar2;
        }
      }
    }
    return local_18;
  }
  __assert_fail("pMat != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                ,0x148,"unsigned int aiGetMaterialTextureCount(const aiMaterial *, aiTextureType)");
}

Assistant:

unsigned int aiGetMaterialTextureCount(const C_STRUCT aiMaterial* pMat,
    C_ENUM aiTextureType type)
{
    ai_assert (pMat != NULL);

    // Textures are always stored with ascending indices (ValidateDS provides a check, so we don't need to do it again)
    unsigned int max = 0;
    for (unsigned int i = 0; i < pMat->mNumProperties;++i) {
        aiMaterialProperty* prop = pMat->mProperties[i];

        if ( prop /* just a sanity check ... */
            && 0 == strcmp( prop->mKey.data, _AI_MATKEY_TEXTURE_BASE )
            && prop->mSemantic == type) {

            max = std::max(max,prop->mIndex+1);
        }
    }
    return max;
}